

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcCShapeProfileDef::~IfcCShapeProfileDef(IfcCShapeProfileDef *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].super_IfcParameterizedProfileDef.field_0x80 = 0x8429c8;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.field_0x68 = 0x8429f0
  ;
  puVar1 = (undefined1 *)this[-1].CentreOfGravityInX.ptr;
  if (puVar1 != &this[-1].field_0xc0) {
    operator_delete(puVar1);
  }
  if ((Maybe<double> *)this[-1].WallThickness != &this[-1].InternalFilletRadius) {
    operator_delete((undefined1 *)this[-1].WallThickness);
  }
  operator_delete(&this[-1].super_IfcParameterizedProfileDef.field_0x80);
  return;
}

Assistant:

IfcCShapeProfileDef() : Object("IfcCShapeProfileDef") {}